

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_result_t eVar1;
  long lVar2;
  exr_encode_pipeline_t *in_RCX;
  long *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  ulong in_R8;
  exr_const_context_t ctxt_2;
  exr_const_context_t ctxt_1;
  exr_const_context_t ctxt;
  void *curbuf;
  size_t *in_stack_ffffffffffffffc0;
  
  if (in_R8 == 0) {
    lVar2 = *(long *)(in_RDI + 0x18);
    if (lVar2 == 0) {
      return 2;
    }
    if ((-1 < *(int *)(in_RDI + 0x14)) && (*(int *)(in_RDI + 0x14) < *(int *)(lVar2 + 0xc4))) {
      eVar1 = (**(code **)(lVar2 + 0x48))
                        (lVar2,3,"Attempt to allocate 0 byte buffer for transcode buffer %d",in_ESI)
      ;
      return eVar1;
    }
    eVar1 = (**(code **)(lVar2 + 0x48))
                      (lVar2,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
    return eVar1;
  }
  if (((void **)*in_RDX == (void **)0x0) || (in_RCX->pipe_size < in_R8)) {
    internal_encode_free_buffer
              (in_RCX,(exr_transcoding_pipeline_buffer_id_t)(in_R8 >> 0x20),(void **)*in_RDX,
               in_stack_ffffffffffffffc0);
    if (*(long *)(in_RDI + 0xe0) == 0) {
      lVar2 = *(long *)(in_RDI + 0x18);
      if (lVar2 == 0) {
        return 2;
      }
      if ((*(int *)(in_RDI + 0x14) < 0) || (*(int *)(lVar2 + 0xc4) <= *(int *)(in_RDI + 0x14))) {
        eVar1 = (**(code **)(lVar2 + 0x48))
                          (lVar2,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
        return eVar1;
      }
      lVar2 = (**(code **)(lVar2 + 0x58))(in_R8);
    }
    else {
      lVar2 = (**(code **)(in_RDI + 0xe0))(in_ESI,in_R8);
    }
    if (lVar2 == 0) {
      lVar2 = *(long *)(in_RDI + 0x18);
      if (lVar2 == 0) {
        return 2;
      }
      if ((-1 < *(int *)(in_RDI + 0x14)) && (*(int *)(in_RDI + 0x14) < *(int *)(lVar2 + 0xc4))) {
        eVar1 = (**(code **)(lVar2 + 0x48))(lVar2,1,"Unable to allocate %lu bytes",in_R8);
        return eVar1;
      }
      eVar1 = (**(code **)(lVar2 + 0x48))
                        (lVar2,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
      return eVar1;
    }
    *in_RDX = lVar2;
    in_RCX->pipe_size = in_R8;
  }
  return 0;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        exr_const_context_t ctxt = encode->context;
        EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            exr_const_context_t ctxt = encode->context;
            EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

            curbuf = ctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            exr_const_context_t ctxt = encode->context;
            EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

            return ctxt->print_error (
                ctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}